

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O2

UChar32 uiter_previous32_63(UCharIterator *iter)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (*(code *)iter->previous)();
  if ((uVar1 & 0xfffffc00) == 0xdc00) {
    uVar2 = (*(code *)iter->previous)(iter);
    if ((uVar2 & 0xfffffc00) == 0xd800) {
      uVar1 = uVar1 + uVar2 * 0x400 + 0xfca02400;
    }
    else if (-1 < (int)uVar2) {
      (*iter->move)(iter,1,UITER_CURRENT);
    }
  }
  return uVar1;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
uiter_previous32(UCharIterator *iter) {
    UChar32 c, c2;

    c=iter->previous(iter);
    if(U16_IS_TRAIL(c)) {
        if(U16_IS_LEAD(c2=iter->previous(iter))) {
            c=U16_GET_SUPPLEMENTARY(c2, c);
        } else if(c2>=0) {
            /* unmatched second surrogate, undo index movement */
            iter->move(iter, 1, UITER_CURRENT);
        }
    }
    return c;
}